

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void freeast(ast *root)

{
  int *in_RDI;
  
  if (in_RDI != (int *)0x0) {
    if (*(long *)(in_RDI + 6) != 0) {
      freeast((ast *)0x10bd49);
    }
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    if (*(long *)(in_RDI + 8) != 0) {
      freeast((ast *)0x10bd6d);
    }
    in_RDI[8] = 0;
    in_RDI[9] = 0;
    if (*(long *)(in_RDI + 4) != 0) {
      if (*in_RDI == 0x11c) {
        free((void *)**(undefined8 **)(in_RDI + 4));
        **(undefined8 **)(in_RDI + 4) = 0;
      }
      free(*(void **)(in_RDI + 4));
      in_RDI[4] = 0;
      in_RDI[5] = 0;
    }
    if (*(long *)(in_RDI + 0xc) != 0) {
      free(*(void **)(in_RDI + 0xc));
      in_RDI[0xc] = 0;
      in_RDI[0xd] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void freeast(struct ast *root) {
    if (!root) return;
    if (root->left) freeast(root->left);
    root->left = NULL;
    if (root->right) freeast(root->right);
    root->right = NULL;
    if (root->val) {
        if (root->type == ID) {
            free(root->val->idval);
            root->val->idval = NULL;
        }
        free(root->val);
        root->val = NULL;
    }
    if (root->pos) {
        free(root->pos);
        root->pos = NULL;
    }
    free(root);
}